

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

bool __thiscall units::measurement::operator==(measurement *this,measurement *other)

{
  double dVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  
  dVar6 = value_as(other,&this->units_);
  dVar1 = this->value_;
  bVar2 = true;
  if ((dVar1 != dVar6) || (NAN(dVar1) || NAN(dVar6))) {
    fVar7 = (float)dVar1;
    fVar8 = (float)dVar6;
    fVar5 = fVar7 - fVar8;
    if (((fVar5 != 0.0) || (NAN(fVar5))) && ((NAN(fVar5) || (0x7ffffe < (int)ABS(fVar5) - 1U)))) {
      fVar5 = (float)((int)fVar7 + 8U & 0xfffffff0);
      fVar3 = (float)((int)fVar8 + 8U & 0xfffffff0);
      if ((fVar5 != fVar3) || (NAN(fVar5) || NAN(fVar3))) {
        fVar4 = (float)((int)(fVar8 * 1.0000005) + 8U & 0xfffffff0);
        if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
          fVar8 = (float)((int)(fVar8 * 0.9999995) + 8U & 0xfffffff0);
          if ((fVar8 != fVar5) || (NAN(fVar8) || NAN(fVar5))) {
            fVar5 = (float)((int)(fVar7 * 1.0000005) + 8U & 0xfffffff0);
            if ((fVar5 != fVar3) || (NAN(fVar5) || NAN(fVar3))) {
              bVar2 = (bool)(-((float)((int)(fVar7 * 0.9999995) + 8U & 0xfffffff0) == fVar3) & 1);
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool operator==(const measurement& other) const
    {
        auto val = other.value_as(units_);
        return (value_ == val) ?
            true :
            detail::compare_round_equals(
                static_cast<float>(value_), static_cast<float>(val));
    }